

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable.hpp
# Opt level: O1

int __thiscall
wigwag::
listenable<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex>
::connect(listenable<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined8 uVar1;
  undefined4 in_register_00000034;
  undefined1 local_18 [16];
  
  uVar1 = *(undefined8 *)CONCAT44(in_register_00000034,__fd);
  local_18._0_2_ = __addr->sa_family;
  local_18[2] = __addr->sa_data[0];
  local_18[3] = __addr->sa_data[1];
  local_18[4] = __addr->sa_data[2];
  local_18[5] = __addr->sa_data[3];
  local_18[6] = __addr->sa_data[4];
  local_18[7] = __addr->sa_data[5];
  local_18._8_8_ = *(undefined8 *)(__addr->sa_data + 6);
  __addr->sa_data[6] = '\0';
  __addr->sa_data[7] = '\0';
  __addr->sa_data[8] = '\0';
  __addr->sa_data[9] = '\0';
  __addr->sa_data[10] = '\0';
  __addr->sa_data[0xb] = '\0';
  __addr->sa_data[0xc] = '\0';
  __addr->sa_data[0xd] = '\0';
  __addr->sa_family = 0;
  __addr->sa_data[0] = '\0';
  __addr->sa_data[1] = '\0';
  __addr->sa_data[2] = '\0';
  __addr->sa_data[3] = '\0';
  __addr->sa_data[4] = '\0';
  __addr->sa_data[5] = '\0';
  detail::
  listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  ::connect((listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
             *)this,(int)uVar1,(sockaddr *)local_18,__len);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._8_8_);
  }
  return (int)this;
}

Assistant:

token connect(ListenerType_ handler, handler_attributes attributes = handler_attributes::none) const
        { return _impl->connect(std::move(handler), attributes); }